

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

void burstsort2_sampling_vector_block(uchar **strings,size_t n)

{
  uchar *ptr;
  byte bVar1;
  bool bVar2;
  undefined8 *puVar3;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *pTVar4;
  vector_block<unsigned_char_*,_128U> *this;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *pTVar5;
  pointer in_RCX;
  size_t sVar6;
  size_t depth;
  long lVar7;
  uint index;
  BurstSimple<unsigned_char> local_51;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *local_50;
  uchar **local_48;
  pointer local_40;
  uchar *str;
  
  local_48 = strings;
  local_50 = (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *)operator_new(0x18);
  (local_50->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_50->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_50->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar7 = 5000;
  for (local_40 = (pointer)0x0; local_40 < n; local_40 = local_40 + 0x400) {
    ptr = local_48[(long)local_40];
    sVar6 = 0;
    in_RCX = local_40;
    pTVar4 = local_50;
    while( true ) {
      bVar1 = get_char<unsigned_char>(ptr,sVar6);
      if (bVar1 == 0) break;
      TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::extend(pTVar4,bVar1 + 1);
      bVar2 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::is_trie
                        (pTVar4,(uint)bVar1);
      if (!bVar2) {
        puVar3 = (undefined8 *)operator_new(0x18);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3[2] = 0;
        in_RCX = (pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 **)((long)in_RCX + (ulong)((uint)bVar1 * 8)) = puVar3;
        make_trie((void **)((ulong)((uint)bVar1 * 8) +
                           (long)(pTVar4->_buckets).
                                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                 super__Vector_impl_data._M_start));
        lVar7 = lVar7 + -1;
        if (lVar7 == 0) goto LAB_001aa9e6;
      }
      pTVar4 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::get_node
                         (pTVar4,(uint)bVar1);
      sVar6 = sVar6 + 1;
      if (pTVar4 == (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xd9,
                      "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char, BucketT = vector_block<unsigned char *, 128>]"
                     );
      }
    }
  }
LAB_001aa9e6:
  sVar6 = 0;
  do {
    if (sVar6 == n) {
      traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,128u>,unsigned_char>
                (local_50,local_48,0,(_func_void_uchar_ptr_ptr_int_int *)in_RCX);
      return;
    }
    str = local_48[sVar6];
    bVar1 = get_char<unsigned_char>(str,0);
    depth = 1;
    pTVar4 = local_50;
    while( true ) {
      index = (uint)bVar1;
      bVar2 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::is_trie(pTVar4,index);
      if (!bVar2) break;
      if (bVar1 == 0) {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xeb,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                     );
      }
      pTVar4 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::get_node(pTVar4,index)
      ;
      bVar1 = get_char<unsigned_char>(str,depth);
      depth = depth + 1;
    }
    this = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::get_bucket
                     (pTVar4,(uint)bVar1);
    if (this == (vector_block<unsigned_char_*,_128U> *)0x0) {
      __assert_fail("bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0xf1,
                    "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                   );
    }
    vector_block<unsigned_char_*,_128U>::push_back(this,&str);
    if ((index != 0) &&
       (in_RCX = (pointer)(ulong)this->_left_in_block,
       0x4000 < (ulong)(((long)(this->_index_block).
                               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_index_block).
                              super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                              ._M_impl.super__Vector_impl_data._M_start) * 0x10 - (long)in_RCX))) {
      pTVar5 = BurstSimple<unsigned_char>::operator()(&local_51,this,depth);
      in_RCX = (pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      in_RCX[bVar1] = pTVar5;
      make_trie((pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start + bVar1);
      vector_block<unsigned_char_*,_128U>::~vector_block(this);
      operator_delete(this);
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

void burstsort2_sampling_vector_block(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_block<unsigned char*, 128> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}